

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_test.cpp
# Opt level: O0

void __thiscall
serial_test_DefaultConstructor_Test::TestBody(serial_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  serial_test *in_RDI;
  AssertionResult gtest_ar_49;
  AssertionResult gtest_ar_48;
  AssertionResult gtest_ar_47;
  AssertionResult gtest_ar_46;
  char *buffer_1;
  size_t size;
  size_t iterator_3;
  serial s_1;
  size_t value_names_size;
  value value_array [19];
  AssertionResult gtest_ar_45;
  AssertionResult gtest_ar_44;
  AssertionResult gtest_ar_43;
  AssertionResult gtest_ar_42;
  AssertionResult gtest_ar_41;
  AssertionResult gtest_ar_40;
  AssertionResult gtest_ar_39;
  AssertionResult gtest_ar_38;
  AssertionResult gtest_ar_37;
  AssertionResult gtest_ar_36;
  AssertionResult gtest_ar_35;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  value *tupla;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  size_t iterator_2;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  value *v_array;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  value *tupla_1;
  size_t iterator_1;
  value *v_map;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  size_t iterator;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  char *buffer;
  AssertionResult gtest_ar_3;
  value v;
  serial s;
  size_t serialize_size;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  memory_allocator allocator;
  AssertionResult gtest_ar;
  memory_allocator_type **in_stack_fffffffffffff120;
  memory_allocator_type **in_stack_fffffffffffff128;
  char *in_stack_fffffffffffff130;
  AssertionResult *pAVar8;
  undefined7 in_stack_fffffffffffff138;
  undefined1 in_stack_fffffffffffff13f;
  undefined7 in_stack_fffffffffffff1e0;
  undefined1 in_stack_fffffffffffff1e7;
  char *in_stack_fffffffffffff1e8;
  serial_test *in_stack_fffffffffffff1f0;
  AssertHelper local_998;
  Message local_990;
  undefined4 local_988;
  undefined4 local_984;
  AssertionResult local_980;
  AssertHelper local_970;
  Message local_968;
  undefined4 local_960;
  undefined4 local_95c;
  AssertionResult local_958;
  AssertHelper local_948;
  Message local_940;
  int local_938;
  undefined4 local_934;
  AssertionResult local_930;
  AssertHelper local_920;
  Message local_918;
  undefined8 local_910;
  long local_908;
  AssertionResult local_900;
  char *local_8f0;
  long local_8e8;
  ulong local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  AssertHelper local_8c8 [20];
  Message local_828;
  int local_820;
  undefined4 local_81c;
  AssertionResult local_818;
  AssertHelper local_808;
  Message local_800;
  undefined8 local_7f8;
  undefined8 local_7f0;
  AssertionResult local_7e8;
  AssertHelper local_7d8;
  Message local_7d0;
  undefined4 local_7c8;
  undefined4 local_7c4;
  AssertionResult local_7c0;
  AssertHelper local_7b0;
  Message local_7a8;
  undefined4 local_7a0;
  undefined4 local_79c;
  AssertionResult local_798;
  AssertHelper local_788;
  Message local_780;
  undefined8 local_778;
  undefined8 local_770;
  AssertionResult local_768;
  AssertHelper local_758;
  Message local_750;
  undefined4 local_748;
  undefined4 local_744;
  AssertionResult local_740;
  AssertHelper local_730;
  Message local_728;
  undefined1 local_71a;
  undefined1 local_719;
  AssertionResult local_718;
  AssertHelper local_708;
  Message local_700;
  undefined8 local_6f8;
  undefined8 local_6f0;
  AssertionResult local_6e8;
  AssertHelper local_6d8;
  Message local_6d0;
  undefined4 local_6c8;
  undefined4 local_6c4;
  AssertionResult local_6c0;
  AssertHelper local_6b0;
  Message local_6a8;
  undefined4 local_6a0;
  undefined4 local_69c;
  AssertionResult local_698;
  AssertHelper local_688;
  Message local_680;
  undefined4 local_678;
  undefined4 local_674;
  AssertionResult local_670;
  AssertHelper local_660;
  Message local_658;
  int local_650;
  undefined4 local_64c;
  AssertionResult local_648;
  AssertHelper local_638;
  Message local_630;
  undefined4 local_628;
  undefined4 local_624;
  AssertionResult local_620;
  AssertHelper local_610;
  Message local_608;
  undefined4 local_600;
  undefined4 local_5fc;
  AssertionResult local_5f8;
  AssertHelper local_5e8;
  Message local_5e0;
  undefined4 local_5d8;
  undefined4 local_5d4;
  AssertionResult local_5d0;
  AssertHelper local_5c0;
  Message local_5b8;
  int local_5b0;
  undefined4 local_5ac;
  AssertionResult local_5a8;
  AssertHelper local_598;
  Message local_590;
  undefined4 local_588;
  undefined4 local_584;
  AssertionResult local_580;
  undefined8 *local_570;
  AssertHelper local_568;
  Message local_560;
  undefined4 local_558;
  undefined4 local_554;
  AssertionResult local_550;
  AssertHelper local_540;
  Message local_538;
  undefined4 local_530;
  undefined4 local_52c;
  AssertionResult local_528;
  AssertHelper local_518;
  Message local_510;
  undefined8 *local_508;
  undefined8 local_500;
  AssertionResult local_4f8;
  AssertHelper local_4e8;
  Message local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  AssertionResult local_4c8;
  AssertHelper local_4b8;
  Message local_4b0;
  undefined4 local_4a8;
  undefined4 local_4a4;
  AssertionResult local_4a0;
  ulong local_490;
  AssertHelper local_488;
  Message local_480;
  undefined4 local_478;
  undefined4 local_474;
  AssertionResult local_470;
  AssertHelper local_460;
  Message local_458;
  undefined4 local_450;
  undefined4 local_44c;
  AssertionResult local_448;
  AssertHelper local_438;
  Message local_430;
  undefined4 local_428;
  undefined4 local_424;
  AssertionResult local_420;
  AssertHelper local_410;
  Message local_408;
  undefined4 local_400;
  undefined4 local_3fc;
  AssertionResult local_3f8;
  AssertHelper local_3e8;
  Message local_3e0;
  int local_3d8;
  undefined4 local_3d4;
  AssertionResult local_3d0;
  AssertHelper local_3c0;
  Message local_3b8;
  undefined4 local_3b0;
  undefined4 local_3ac;
  AssertionResult local_3a8;
  AssertHelper local_398;
  Message local_390;
  undefined8 *local_388;
  undefined8 local_380;
  AssertionResult local_378;
  undefined8 *local_368;
  AssertHelper local_360;
  Message local_358;
  undefined8 local_350;
  undefined8 local_348;
  AssertionResult local_340;
  AssertHelper local_330;
  Message local_328;
  undefined4 local_320;
  undefined4 local_31c;
  AssertionResult local_318;
  AssertHelper local_308;
  Message local_300;
  int local_2f8;
  undefined4 local_2f4;
  AssertionResult local_2f0;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  AssertionResult local_2c0;
  AssertHelper local_2b0;
  Message local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  AssertionResult local_290;
  AssertHelper local_280;
  Message local_278;
  undefined8 local_270;
  undefined8 local_268;
  AssertionResult local_260;
  undefined8 *local_250;
  ulong local_248;
  undefined8 *local_240;
  AssertHelper local_238;
  Message local_230;
  int local_228;
  undefined4 local_224;
  AssertionResult local_220;
  AssertHelper local_210;
  Message local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  AssertionResult local_1f0;
  AssertHelper local_1e0;
  Message local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  AssertionResult local_1c0;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  AssertionResult local_190;
  ulong local_180;
  AssertHelper local_178;
  Message local_170;
  int local_168;
  undefined4 local_164;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  char *local_140;
  undefined8 local_138;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined8 local_110;
  undefined8 local_108;
  AssertionResult local_100;
  char *local_f0;
  AssertHelper local_e8;
  Message local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  AssertionResult local_c8;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  AssertHelper local_a0;
  Message local_98;
  undefined4 local_90;
  undefined4 local_8c;
  AssertionResult local_88;
  AssertHelper local_78;
  Message local_70;
  undefined8 local_68;
  undefined8 local_60;
  AssertionResult local_58;
  undefined8 local_48;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  uVar3 = log_policy_format_text();
  uVar4 = log_policy_schedule_sync();
  uVar5 = log_policy_storage_sequential();
  uVar6 = log_policy_stream_stdio(_stdout);
  local_20 = log_configure_impl("metacall",4,uVar3,uVar4,uVar5,uVar6);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10bc75);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x43,pcVar7);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10bcd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bd30);
  local_68 = memory_allocator_std(malloc,realloc,free);
  local_60 = 0;
  local_48 = local_68;
  testing::internal::CmpHelperNE<memory_allocator_type*,memory_allocator_type*>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10be10);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x48,pcVar7);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x10be73);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bec8);
  local_8c = 0;
  local_90 = serial_initialize();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10bf81);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x4b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message((Message *)0x10bfe4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c03c);
  serial_test::rapid_json_name(in_RDI);
  serial_test::rapid_json_extension(in_RDI);
  serial_test::create_serial
            (in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8,
             (char *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0));
  serial_test::metacall_name(in_RDI);
  serial_test::metacall_extension(in_RDI);
  serial_test::create_serial
            (in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8,
             (char *)CONCAT17(in_stack_fffffffffffff1e7,in_stack_fffffffffffff1e0));
  if ((TestBody()::value_list == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::value_list), iVar2 != 0)) {
    TestBody::value_list[0] = (value)value_create_int(0xf4);
    TestBody::value_list[1] = (value)value_create_double(0x401b333333333333);
    TestBody::value_list[2] = (value)value_create_string("hello world",0xb);
    __cxa_guard_release(&TestBody()::value_list);
  }
  if ((TestBody()::value_map_a == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::value_map_a), iVar2 != 0)) {
    TestBody::value_map_a[0] = (value)value_create_string("aaa",3);
    TestBody::value_map_a[1] = (value)value_create_double(0x400aa9fbe76c8b44);
    __cxa_guard_release(&TestBody()::value_map_a);
  }
  if ((TestBody()::value_map_b == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::value_map_b), iVar2 != 0)) {
    TestBody::value_map_b[0] = (value)value_create_string("bbb",3);
    TestBody::value_map_b[1] = (value)value_create_double(0x4012000000000000);
    __cxa_guard_release(&TestBody()::value_map_b);
  }
  if ((TestBody()::value_map == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::value_map), iVar2 != 0)) {
    TestBody::value_map[0] = (value)value_create_array(TestBody::value_map_a,2);
    TestBody::value_map[1] = (value)value_create_array(TestBody::value_map_b,2);
    __cxa_guard_release(&TestBody()::value_map);
  }
  local_a8 = 0;
  pcVar7 = serial_test::rapid_json_name(in_RDI);
  local_b0 = serial_create(pcVar7);
  local_d8 = value_create_array(TestBody::value_list,3);
  local_d0 = 0;
  local_b8 = local_d8;
  testing::internal::CmpHelperNE<void*,void*>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c44a);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x88,pcVar7);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message((Message *)0x10c4ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c505);
  local_f0 = (char *)serial_serialize(local_b0,local_b8,&local_a8,local_48);
  local_108 = 0x18;
  local_110 = local_a8;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(unsigned_long *)in_stack_fffffffffffff128,
             (unsigned_long *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c5f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x8d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x10c653);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c6ab);
  local_138 = 0;
  local_140 = local_f0;
  testing::internal::CmpHelperNE<char*,char*>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(char **)in_stack_fffffffffffff128,
             (char **)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c769);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x8e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message((Message *)0x10c7cc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c824);
  local_164 = 0;
  local_168 = strcmp(local_f0,"[244,6.8,\"hello world\"]");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c8ec);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x8f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x10c94f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c9a4);
  value_destroy(local_b8);
  for (local_180 = 0; local_180 < 3; local_180 = local_180 + 1) {
    value_destroy(TestBody::value_list[local_180]);
  }
  memory_allocator_deallocate(local_48,local_f0);
  local_1a0 = value_create_map(TestBody::value_map,2);
  local_198 = 0;
  local_b8 = local_1a0;
  testing::internal::CmpHelperNE<void*,void*>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10cae2);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x9d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message((Message *)0x10cb45);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cb9d);
  local_f0 = (char *)serial_serialize(local_b0,local_b8,&local_a8,local_48);
  local_1c8 = 0x18;
  local_1d0 = local_a8;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(unsigned_long *)in_stack_fffffffffffff128,
             (unsigned_long *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10cc88);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xa2,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message((Message *)0x10cceb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cd43);
  local_1f8 = 0;
  local_200 = local_b8;
  testing::internal::CmpHelperNE<void*,void*>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10ce01);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xa3,pcVar7);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message((Message *)0x10ce64);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cebc);
  local_224 = 0;
  local_228 = strcmp(local_f0,"{\"aaa\":3.333,\"bbb\":4.5}");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10cf84);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xa4,pcVar7);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message((Message *)0x10cfe7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d03f);
  local_240 = (undefined8 *)value_to_map(local_b8);
  for (local_248 = 0; local_248 < 2; local_248 = local_248 + 1) {
    local_250 = (undefined8 *)value_to_array(*(undefined8 *)((long)local_240 + local_248 * 8));
    value_destroy(*local_250);
    value_destroy(local_250[1]);
    value_destroy(*(undefined8 *)((long)local_240 + local_248 * 8));
  }
  value_destroy(local_b8);
  memory_allocator_deallocate(local_48,local_f0);
  local_270 = value_create_array(0);
  local_268 = 0;
  local_b8 = local_270;
  testing::internal::CmpHelperNE<void*,void*>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d1d4);
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xb9,pcVar7);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    testing::Message::~Message((Message *)0x10d237);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d28f);
  local_f0 = (char *)serial_serialize(local_b0,local_b8,&local_a8,local_48);
  local_298 = 3;
  local_2a0 = local_a8;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(unsigned_long *)in_stack_fffffffffffff128,
             (unsigned_long *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d37a);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xbe,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    testing::Message::~Message((Message *)0x10d3dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d435);
  local_2c8 = 0;
  local_2d0 = local_b8;
  testing::internal::CmpHelperNE<void*,void*>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d4f3);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xbf,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    testing::Message::~Message((Message *)0x10d556);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d5ae);
  local_2f4 = 0;
  local_2f8 = strcmp(local_f0,"[]");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d676);
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xc0,pcVar7);
    testing::internal::AssertHelper::operator=(&local_308,&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    testing::Message::~Message((Message *)0x10d6d9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d731);
  value_destroy(local_b8);
  memory_allocator_deallocate(local_48,local_f0);
  local_b8 = serial_deserialize(local_b0,"[\"asdf\",443,3.2]",0x11,local_48);
  local_31c = 9;
  local_320 = value_type_id(local_b8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d83d);
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xc9,pcVar7);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    testing::Message::~Message((Message *)0x10d8a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d8f8);
  local_348 = 3;
  local_350 = value_type_count(local_b8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(unsigned_long *)in_stack_fffffffffffff128,
             (unsigned_long *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d9bb);
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xca,pcVar7);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    testing::Message::~Message((Message *)0x10da1e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10da76);
  local_388 = (undefined8 *)value_to_array(local_b8);
  local_380 = 0;
  local_368 = local_388;
  testing::internal::CmpHelperNE<void**,void**>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(void ***)in_stack_fffffffffffff128,
             (void ***)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_378);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10db49);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xce,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::Message::~Message((Message *)0x10dbac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dc04);
  local_3ac = 7;
  local_3b0 = value_type_id(*local_368);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10dcc8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd0,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    testing::Message::~Message((Message *)0x10dd2b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dd83);
  local_3d4 = 0;
  pcVar7 = (char *)value_to_string(*local_368);
  local_3d8 = strcmp(pcVar7,"asdf");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10de56);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd1,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    testing::Message::~Message((Message *)0x10deb9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10df11);
  local_3fc = 3;
  local_400 = value_type_id(local_368[1]);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10dfd6);
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd3,pcVar7);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    testing::Message::~Message((Message *)0x10e039);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e091);
  local_424 = 0x1bb;
  local_428 = value_to_int(local_368[1]);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_420);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e156);
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd4,pcVar7);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    testing::Message::~Message((Message *)0x10e1b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e211);
  local_44c = 5;
  local_450 = value_type_id(local_368[2]);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_448);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e2d6);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd6,pcVar7);
    testing::internal::AssertHelper::operator=(&local_460,&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    testing::Message::~Message((Message *)0x10e339);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e391);
  local_474 = 0x404ccccd;
  local_478 = value_to_float(local_368[2]);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(float *)in_stack_fffffffffffff128,
             (float *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_470);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e458);
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xd7,pcVar7);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    testing::Message::~Message((Message *)0x10e4bb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e510);
  for (local_490 = 0; local_490 < 3; local_490 = local_490 + 1) {
    value_destroy(local_368[local_490]);
  }
  value_destroy(local_b8);
  local_b8 = serial_deserialize(local_b0,"{\"abc\":9.9,\"cde\":1.5}",0x16,local_48);
  local_4a4 = 10;
  local_4a8 = value_type_id(local_b8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e64d);
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xe3,pcVar7);
    testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    testing::Message::~Message((Message *)0x10e6b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e708);
  local_4d0 = 2;
  local_4d8 = value_type_count(local_b8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(unsigned_long *)in_stack_fffffffffffff128,
             (unsigned_long *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e7cb);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xe4,pcVar7);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    testing::Message::~Message((Message *)0x10e82e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e886);
  local_508 = (undefined8 *)value_to_map(local_b8);
  local_500 = 0;
  local_240 = local_508;
  testing::internal::CmpHelperNE<void**,void**>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(void ***)in_stack_fffffffffffff128,
             (void ***)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e959);
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xe8,pcVar7);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    testing::Message::~Message((Message *)0x10e9bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ea14);
  local_52c = 9;
  local_530 = value_type_id(*local_240);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_528);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10ead8);
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xea,pcVar7);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    testing::Message::~Message((Message *)0x10eb3b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10eb93);
  local_554 = 9;
  local_558 = value_type_id(local_240[1]);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_550);
  if (!bVar1) {
    testing::Message::Message(&local_560);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10ec58);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xeb,pcVar7);
    testing::internal::AssertHelper::operator=(&local_568,&local_560);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    testing::Message::~Message((Message *)0x10ecbb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ed13);
  local_570 = (undefined8 *)value_to_array(*local_240);
  local_584 = 7;
  local_588 = value_type_id(*local_570);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_580);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10edef);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xef,pcVar7);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    testing::Message::~Message((Message *)0x10ee52);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10eeaa);
  local_5ac = 0;
  pcVar7 = (char *)value_to_string(*local_570);
  local_5b0 = strcmp(pcVar7,"abc");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10ef7d);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xf0,pcVar7);
    testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::Message::~Message((Message *)0x10efe0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f038);
  local_5d4 = 5;
  local_5d8 = value_type_id(local_570[1]);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10f0fd);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xf2,pcVar7);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    testing::Message::~Message((Message *)0x10f160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f1b8);
  local_5fc = 0x411e6666;
  local_600 = value_to_float(local_570[1]);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(float *)in_stack_fffffffffffff128,
             (float *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10f27f);
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xf3,pcVar7);
    testing::internal::AssertHelper::operator=(&local_610,&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    testing::Message::~Message((Message *)0x10f2e2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f33a);
  value_destroy(*local_570);
  value_destroy(local_570[1]);
  value_destroy(*local_240);
  local_570 = (undefined8 *)value_to_array(local_240[1]);
  local_624 = 7;
  local_628 = value_type_id(*local_570);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_620);
  if (!bVar1) {
    testing::Message::Message(&local_630);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10f448);
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xfc,pcVar7);
    testing::internal::AssertHelper::operator=(&local_638,&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    testing::Message::~Message((Message *)0x10f4ab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f503);
  local_64c = 0;
  pcVar7 = (char *)value_to_string(*local_570);
  local_650 = strcmp(pcVar7,"cde");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_648);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10f5d6);
    testing::internal::AssertHelper::AssertHelper
              (&local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xfd,pcVar7);
    testing::internal::AssertHelper::operator=(&local_660,&local_658);
    testing::internal::AssertHelper::~AssertHelper(&local_660);
    testing::Message::~Message((Message *)0x10f639);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f691);
  local_674 = 5;
  local_678 = value_type_id(local_570[1]);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_670);
  if (!bVar1) {
    testing::Message::Message(&local_680);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10f756);
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0xff,pcVar7);
    testing::internal::AssertHelper::operator=(&local_688,&local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    testing::Message::~Message((Message *)0x10f7b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f811);
  local_69c = 0x3fc00000;
  local_6a0 = value_to_float(local_570[1]);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(float *)in_stack_fffffffffffff128,
             (float *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_698);
  if (!bVar1) {
    testing::Message::Message(&local_6a8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10f8d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x100,pcVar7);
    testing::internal::AssertHelper::operator=(&local_6b0,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    testing::Message::~Message((Message *)0x10f93b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f993);
  value_destroy(*local_570);
  value_destroy(local_570[1]);
  value_destroy(local_240[1]);
  value_destroy(local_b8);
  local_b8 = serial_deserialize(local_b0,"true",5,local_48);
  local_6c4 = 0;
  local_6c8 = value_type_id(local_b8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6d0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10fabc);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x10c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    testing::Message::~Message((Message *)0x10fb1f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fb77);
  local_6f0 = 1;
  local_6f8 = value_type_size(local_b8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(unsigned_long *)in_stack_fffffffffffff128,
             (unsigned_long *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6e8);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10fc3a);
    testing::internal::AssertHelper::AssertHelper
              (&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x10d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_708,&local_700);
    testing::internal::AssertHelper::~AssertHelper(&local_708);
    testing::Message::~Message((Message *)0x10fc9d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fcf5);
  local_719 = 1;
  local_71a = value_to_bool(local_b8);
  testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(uchar *)in_stack_fffffffffffff128,
             (uchar *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_718);
  if (!bVar1) {
    testing::Message::Message(&local_728);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10fdb3);
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x10e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    testing::Message::~Message((Message *)0x10fe16);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fe6e);
  value_destroy(local_b8);
  local_b8 = serial_deserialize(local_b0,"23434",6,local_48);
  local_744 = 3;
  local_748 = value_type_id(local_b8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_740);
  if (!bVar1) {
    testing::Message::Message(&local_750);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10ff65);
    testing::internal::AssertHelper::AssertHelper
              (&local_758,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x115,pcVar7);
    testing::internal::AssertHelper::operator=(&local_758,&local_750);
    testing::internal::AssertHelper::~AssertHelper(&local_758);
    testing::Message::~Message((Message *)0x10ffc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110020);
  local_770 = 4;
  local_778 = value_type_size(local_b8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(unsigned_long *)in_stack_fffffffffffff128,
             (unsigned_long *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_768);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x1100e3);
    testing::internal::AssertHelper::AssertHelper
              (&local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x116,pcVar7);
    testing::internal::AssertHelper::operator=(&local_788,&local_780);
    testing::internal::AssertHelper::~AssertHelper(&local_788);
    testing::Message::~Message((Message *)0x110146);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11019e);
  local_79c = 0x5b8a;
  local_7a0 = value_to_int(local_b8);
  pAVar8 = &local_798;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
  if (!bVar1) {
    testing::Message::Message(&local_7a8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x11025f);
    testing::internal::AssertHelper::AssertHelper
              (&local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x117,pcVar7);
    testing::internal::AssertHelper::operator=(&local_7b0,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper(&local_7b0);
    testing::Message::~Message((Message *)0x1102c2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11031a);
  value_destroy(local_b8);
  local_b8 = serial_deserialize(local_b0,"\"Hello World\"",0xe,local_48);
  local_7c4 = 7;
  local_7c8 = value_type_id(local_b8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7c0);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x110411);
    testing::internal::AssertHelper::AssertHelper
              (&local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x11e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper(&local_7d8);
    testing::Message::~Message((Message *)0x110474);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1104cc);
  local_7f0 = 0xc;
  local_7f8 = value_type_size(local_b8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(unsigned_long *)in_stack_fffffffffffff128,
             (unsigned_long *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7e8);
  if (!bVar1) {
    testing::Message::Message(&local_800);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x11058f);
    testing::internal::AssertHelper::AssertHelper
              (&local_808,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x11f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_808,&local_800);
    testing::internal::AssertHelper::~AssertHelper(&local_808);
    testing::Message::~Message((Message *)0x1105f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11064a);
  local_81c = 0;
  pcVar7 = (char *)value_to_string(local_b8);
  local_820 = strncmp(pcVar7,"Hello World",0xb);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_818);
  if (!bVar1) {
    testing::Message::Message(&local_828);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x11071f);
    testing::internal::AssertHelper::AssertHelper
              (local_8c8 + 0x13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x120,pcVar7);
    testing::internal::AssertHelper::operator=(local_8c8 + 0x13,&local_828);
    testing::internal::AssertHelper::~AssertHelper(local_8c8 + 0x13);
    testing::Message::~Message((Message *)0x110782);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1107da);
  value_destroy(local_b8);
  if ((TestBody()::value_list == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::value_list), iVar2 != 0)) {
    TestBody()::value_list[0] = (value)value_create_int(0xf4);
    TestBody()::value_list[1] = (value)value_create_double(0x401b333333333333);
    TestBody()::value_list[2] = (value)value_create_string("hello world",0xb);
    __cxa_guard_release(&TestBody()::value_list);
  }
  local_8c8[0].data_ = (AssertHelperData *)value_create_bool(1);
  local_8c8[1].data_ = (AssertHelperData *)value_create_char(0x41);
  local_8c8[2].data_ = (AssertHelperData *)value_create_short(0x7b);
  local_8c8[3].data_ = (AssertHelperData *)value_create_int(0xdc90);
  local_8c8[4].data_ = (AssertHelperData *)value_create_long(0xef9ca33);
  local_8c8[5].data_ = (AssertHelperData *)value_create_float(0x4158b852);
  local_8c8[6].data_ = (AssertHelperData *)value_create_double(0x40810ac32ca57a78);
  local_8c8[7].data_ = (AssertHelperData *)value_create_string("hello world",0xb);
  local_8c8[8].data_ = (AssertHelperData *)value_create_buffer("\x05\x06\a\b",4);
  local_8c8[9].data_ = (AssertHelperData *)value_create_array(TestBody()::value_list,3);
  local_8c8[10].data_ = (AssertHelperData *)0x0;
  local_8c8[0xb].data_ = (AssertHelperData *)value_create_ptr(0xa7ef2);
  local_8c8[0xc].data_ = (AssertHelperData *)0x0;
  local_8c8[0xd].data_ = (AssertHelperData *)0x0;
  local_8c8[0xe].data_ = (AssertHelperData *)value_create_null();
  local_8c8[0xf].data_ = (AssertHelperData *)0x0;
  local_8c8[0x10].data_ = (AssertHelperData *)0x0;
  local_8c8[0x11].data_ = (AssertHelperData *)0x0;
  local_8c8[0x12].data_ = (AssertHelperData *)0x0;
  local_8d0 = 0x13;
  pcVar7 = serial_test::metacall_name(in_RDI);
  local_8d8 = serial_create(pcVar7);
  for (local_8e0 = 0; local_8e0 < 0x13; local_8e0 = local_8e0 + 1) {
    if (TestBody::value_names[local_8e0] != (char *)0x0) {
      local_8f0 = (char *)serial_serialize(local_8d8,local_8c8[local_8e0].data_,&local_8e8,local_48)
      ;
      in_stack_fffffffffffff120 = (memory_allocator_type **)TestBody::value_names[local_8e0];
      log_write_impl_va("metacall",0x1ab,"TestBody",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
                        ,0,"(%s == %s)",local_8f0);
      local_908 = local_8e8;
      local_910 = 0;
      testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
                 in_stack_fffffffffffff130,(unsigned_long *)in_stack_fffffffffffff128,
                 (unsigned_long *)in_stack_fffffffffffff120);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_900);
      if (!bVar1) {
        testing::Message::Message(&local_918);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x110b75);
        testing::internal::AssertHelper::AssertHelper
                  (&local_920,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
                   ,0x1ad,pcVar7);
        testing::internal::AssertHelper::operator=(&local_920,&local_918);
        testing::internal::AssertHelper::~AssertHelper(&local_920);
        testing::Message::~Message((Message *)0x110bd2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x110c2a);
      local_934 = 0;
      local_938 = strncmp(local_8f0,TestBody::value_names[local_8e0],local_8e8 - 1);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
                 in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
                 (int *)in_stack_fffffffffffff120);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_930);
      if (!bVar1) {
        testing::Message::Message(&local_940);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x110cfd);
        testing::internal::AssertHelper::AssertHelper
                  (&local_948,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
                   ,0x1af,pcVar7);
        testing::internal::AssertHelper::operator=(&local_948,&local_940);
        testing::internal::AssertHelper::~AssertHelper(&local_948);
        testing::Message::~Message((Message *)0x110d5a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x110daf);
      memory_allocator_deallocate(local_48,local_8f0);
      value_type_destroy(local_8c8[local_8e0].data_);
    }
  }
  local_95c = 0;
  pcVar7 = serial_test::rapid_json_name(in_RDI);
  uVar3 = serial_create(pcVar7);
  local_960 = serial_clear(uVar3);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),
             in_stack_fffffffffffff130,(int *)in_stack_fffffffffffff128,
             (int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_958);
  if (!bVar1) {
    testing::Message::Message(&local_968);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x110ebb);
    testing::internal::AssertHelper::AssertHelper
              (&local_970,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x1b9,pcVar7);
    testing::internal::AssertHelper::operator=(&local_970,&local_968);
    testing::internal::AssertHelper::~AssertHelper(&local_970);
    testing::Message::~Message((Message *)0x110f18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110f70);
  local_984 = 0;
  pcVar7 = serial_test::metacall_name(in_RDI);
  uVar3 = serial_create(pcVar7);
  local_988 = serial_clear(uVar3);
  pAVar8 = &local_980;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffff13f,in_stack_fffffffffffff138),&pAVar8->success_
             ,(int *)in_stack_fffffffffffff128,(int *)in_stack_fffffffffffff120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
  if (!bVar1) {
    testing::Message::Message(&local_990);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x111035);
    testing::internal::AssertHelper::AssertHelper
              (&local_998,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x1bc,pcVar7);
    testing::internal::AssertHelper::operator=(&local_998,&local_990);
    testing::internal::AssertHelper::~AssertHelper(&local_998);
    testing::Message::~Message((Message *)0x111092);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1110e7);
  serial_destroy();
  memory_allocator_destroy(local_48);
  return;
}

Assistant:

TEST_F(serial_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	// Create allocator
	memory_allocator allocator = memory_allocator_std(&malloc, &realloc, &free);

	EXPECT_NE((memory_allocator)NULL, (memory_allocator)allocator);

	// Initialize serial
	EXPECT_EQ((int)0, (int)serial_initialize());

	// Create RapidJSON serial
	create_serial(rapid_json_name(), rapid_json_extension());

	// Create MetaCall serial
	create_serial(metacall_name(), metacall_extension());

	// RapidJSON
	{
		static const char hello_world[] = "hello world";

		static const value value_list[] = {
			value_create_int(244),
			value_create_double(6.8),
			value_create_string(hello_world, sizeof(hello_world) - 1)
		};

		static const char map_index_a[] = "aaa";
		static const char map_index_b[] = "bbb";

		static const value value_map_a[] = {
			value_create_string(map_index_a, sizeof(map_index_a) - 1),
			value_create_double(3.333)
		};

		static const value value_map_b[] = {
			value_create_string(map_index_b, sizeof(map_index_b) - 1),
			value_create_double(4.5)
		};

		static const value value_map[] = {
			value_create_array(value_map_a, sizeof(value_map_a) / sizeof(value_map_a[0])),
			value_create_array(value_map_b, sizeof(value_map_b) / sizeof(value_map_b[0]))
		};

		static const size_t value_list_size = sizeof(value_list) / sizeof(value_list[0]);
		static const char value_list_str[] = "[244,6.8,\"hello world\"]";
		static const size_t value_map_size = sizeof(value_map) / sizeof(value_map[0]);
		static const char value_map_str[] = "{\"aaa\":3.333,\"bbb\":4.5}";

		static const char json_buffer_array[] = "[\"asdf\",443,3.2]";
		static const size_t json_buffer_array_size = 3;

		static const char json_buffer_map[] = "{\"abc\":9.9,\"cde\":1.5}";
		static const size_t json_buffer_map_size = 2;

		static const char json_true[] = "true";
		static const char json_number[] = "23434";
		static const char json_string[] = "\"Hello World\"";
		static const char json_string_value[] = "Hello World";

		static const char json_empty_array[] = "[]";

		size_t serialize_size = 0;

		serial s = serial_create(rapid_json_name());

		// Create value array from value list
		value v = value_create_array(value_list, value_list_size);

		EXPECT_NE((value)NULL, (value)v);

		// Serialize value array into buffer
		char *buffer = serial_serialize(s, v, &serialize_size, allocator);

		EXPECT_EQ((size_t)sizeof(value_list_str), (size_t)serialize_size);
		EXPECT_NE((char *)NULL, (char *)buffer);
		EXPECT_EQ((int)0, (int)strcmp(buffer, value_list_str));

		value_destroy(v);

		for (size_t iterator = 0; iterator < value_list_size; ++iterator)
		{
			value_destroy(value_list[iterator]);
		}

		memory_allocator_deallocate(allocator, buffer);

		// Create value map from value list map
		v = value_create_map(value_map, value_map_size);

		EXPECT_NE((value)NULL, (value)v);

		// Serialize value map into buffer
		buffer = serial_serialize(s, v, &serialize_size, allocator);

		EXPECT_EQ((size_t)sizeof(value_map_str), (size_t)serialize_size);
		EXPECT_NE((value)NULL, (value)v);
		EXPECT_EQ((int)0, (int)strcmp(buffer, value_map_str));

		value *v_map = value_to_map(v);

		for (size_t iterator = 0; iterator < value_map_size; ++iterator)
		{
			value *tupla = value_to_array(v_map[iterator]);

			value_destroy(tupla[0]);
			value_destroy(tupla[1]);

			value_destroy(v_map[iterator]);
		}

		value_destroy(v);

		memory_allocator_deallocate(allocator, buffer);

		// Create an empty array
		v = value_create_array(NULL, 0);

		EXPECT_NE((value)NULL, (value)v);

		// Serialize empty array into buffer
		buffer = serial_serialize(s, v, &serialize_size, allocator);

		EXPECT_EQ((size_t)sizeof(json_empty_array), (size_t)serialize_size);
		EXPECT_NE((value)NULL, (value)v);
		EXPECT_EQ((int)0, (int)strcmp(buffer, json_empty_array));

		value_destroy(v);

		memory_allocator_deallocate(allocator, buffer);

		// Deserialize json buffer array into value
		v = serial_deserialize(s, json_buffer_array, sizeof(json_buffer_array), allocator);

		EXPECT_EQ((type_id)TYPE_ARRAY, (type_id)value_type_id(v));
		EXPECT_EQ((size_t)json_buffer_array_size, (size_t)value_type_count(v));

		value *v_array = value_to_array(v);

		EXPECT_NE((value *)NULL, (value *)v_array);

		EXPECT_EQ((type_id)TYPE_STRING, (type_id)value_type_id(v_array[0]));
		EXPECT_EQ((int)0, (int)strcmp(value_to_string(v_array[0]), "asdf"));

		EXPECT_EQ((type_id)TYPE_INT, (type_id)value_type_id(v_array[1]));
		EXPECT_EQ((int)443, (int)value_to_int(v_array[1]));

		EXPECT_EQ((type_id)TYPE_FLOAT, (type_id)value_type_id(v_array[2]));
		EXPECT_EQ((float)3.2f, (float)value_to_float(v_array[2]));

		for (size_t iterator = 0; iterator < value_list_size; ++iterator)
		{
			value_destroy(v_array[iterator]);
		}

		value_destroy(v);

		// Deserialize json buffer map into value
		v = serial_deserialize(s, json_buffer_map, sizeof(json_buffer_map), allocator);

		EXPECT_EQ((type_id)TYPE_MAP, (type_id)value_type_id(v));
		EXPECT_EQ((size_t)json_buffer_map_size, (size_t)value_type_count(v));

		v_map = value_to_map(v);

		EXPECT_NE((value *)NULL, (value *)v_map);

		EXPECT_EQ((type_id)TYPE_ARRAY, (type_id)value_type_id(v_map[0]));
		EXPECT_EQ((type_id)TYPE_ARRAY, (type_id)value_type_id(v_map[1]));

		value *tupla = value_to_array(v_map[0]);

		EXPECT_EQ((type_id)TYPE_STRING, (type_id)value_type_id(tupla[0]));
		EXPECT_EQ((int)0, (int)strcmp(value_to_string(tupla[0]), "abc"));

		EXPECT_EQ((type_id)TYPE_FLOAT, (type_id)value_type_id(tupla[1]));
		EXPECT_EQ((float)9.9f, (float)value_to_float(tupla[1]));

		value_destroy(tupla[0]);
		value_destroy(tupla[1]);

		value_destroy(v_map[0]);

		tupla = value_to_array(v_map[1]);

		EXPECT_EQ((type_id)TYPE_STRING, (type_id)value_type_id(tupla[0]));
		EXPECT_EQ((int)0, (int)strcmp(value_to_string(tupla[0]), "cde"));

		EXPECT_EQ((type_id)TYPE_FLOAT, (type_id)value_type_id(tupla[1]));
		EXPECT_EQ((float)1.5f, (float)value_to_float(tupla[1]));

		value_destroy(tupla[0]);
		value_destroy(tupla[1]);

		value_destroy(v_map[1]);

		value_destroy(v);

		// Deserialize json boolean primitive type into value
		v = serial_deserialize(s, json_true, sizeof(json_true), allocator);

		EXPECT_EQ((type_id)TYPE_BOOL, (type_id)value_type_id(v));
		EXPECT_EQ((size_t)sizeof(boolean), (size_t)value_type_size(v));
		EXPECT_EQ((boolean)1L, (boolean)value_to_bool(v));

		value_destroy(v);

		// Deserialize json number primitive type into value
		v = serial_deserialize(s, json_number, sizeof(json_number), allocator);

		EXPECT_EQ((type_id)TYPE_INT, (type_id)value_type_id(v));
		EXPECT_EQ((size_t)sizeof(int), (size_t)value_type_size(v));
		EXPECT_EQ((int)23434, (int)value_to_int(v));

		value_destroy(v);

		// Deserialize json string primitive type into value
		v = serial_deserialize(s, json_string, sizeof(json_string), allocator);

		EXPECT_EQ((type_id)TYPE_STRING, (type_id)value_type_id(v));
		EXPECT_EQ((size_t)sizeof(json_string_value), (size_t)value_type_size(v));
		EXPECT_EQ((int)0, (int)strncmp(value_to_string(v), json_string_value, sizeof(json_string_value) - 1));

		value_destroy(v);
	}

	// MetaCall
	{
		static const char hello_world[] = "hello world";
		static const size_t hello_world_length = sizeof(hello_world) - 1;

		static const char *value_names[] = {
			"true",
			"A",
			"123",
			"56464",
			"251251251",
			"13.545000f",
			"545.345300",
			hello_world,
			"05060708",
			"[244,6.800000,hello world]",
			NULL, /* TODO: Map */
#if defined(_WIN32) && defined(_MSC_VER)
	#if defined(_WIN64)
			"0x00000000000A7EF2",
	#else
			"0x000A7EF2",
	#endif
#elif defined(__linux) || defined(__linux__) || defined(__APPLE__)
			"0xa7ef2",
#else
			"<unknown>",
#endif
			NULL, /* TODO: Future */
			NULL, /* TODO: Function */
			"(null)",
			NULL, /* TODO: Class */
			NULL, /* TODO: Object */
			NULL, /* TODO: Exception */
			NULL  /* TODO: Throwable */
		};

		portability_static_assert((int)sizeof(value_names) / sizeof(value_names[0]) == (int)TYPE_SIZE,
			"Value names size does not match type size.");

		static const char char_array[] = {
			0x05, 0x06, 0x07, 0x08
		};

		static const value value_list[] = {
			value_create_int(244),
			value_create_double(6.8),
			value_create_string(hello_world, hello_world_length)
		};

		static const size_t value_list_size = sizeof(value_list) / sizeof(value_list[0]);

		/* TODO: Implement map properly */
		/*
		static const char good_bye[] = "good bye";
		static const size_t good_bye_length = sizeof(good_bye) - 1;

		static const value value_map_tupla_a[] =
		{
			value_create_string(hello_world, hello_world_length),
			value_create_int(9874),
		};

		static const value value_map_tupla_b[] =
		{
			value_create_string(good_bye, good_bye_length),
			value_create_int(1111),
		};

		static const value value_map[] =
		{
			value_create_array(value_map_tupla_a, sizeof(value_map_tupla_a) / sizeof(value_map_tupla_a[0])),
			value_create_array(value_map_tupla_b, sizeof(value_map_tupla_b) / sizeof(value_map_tupla_b[0]))
		};

		static const size_t value_map_size = sizeof(value_map) / sizeof(value_map[0]);
		*/

		/* TODO: Implement class properly */
		/* klass cls = class_create(NULL, ACCESSOR_TYPE_STATIC, NULL, NULL); */

		value value_array[] = {
			value_create_bool(1),
			value_create_char('A'),
			value_create_short(123),
			value_create_int(56464),
			value_create_long(251251251L),
			value_create_float(13.545f),
			value_create_double(545.3453),
			value_create_string(hello_world, hello_world_length),
			value_create_buffer(char_array, sizeof(char_array)),
			value_create_array(value_list, value_list_size),
			/* TODO: Implement map properly */
			NULL,
			/*
			value_create_map(value_map, value_map_size),
			*/
			value_create_ptr((void *)0x000A7EF2),
			/* TODO: Implement class properly */
			NULL,
			NULL,
			/*
			value_create_future(future_create(NULL, NULL)),
			value_create_function(function_create(NULL, 0, NULL, NULL)),
			*/
			value_create_null(),
			/* TODO: Implement class properly */
			NULL,
			NULL,
			/*
			value_create_class(cls),
			value_create_object(class_new(cls, NULL, NULL, 0)),
			*/
			/* TODO: Implement exception properly */
			NULL,
			NULL
		};

		portability_static_assert((int)sizeof(value_array) / sizeof(value_array[0]) == (int)TYPE_SIZE,
			"Value array size does not match type size.");

		const size_t value_names_size = sizeof(value_names) / sizeof(value_names[0]);

		serial s = serial_create(metacall_name());

		for (size_t iterator = 0; iterator < value_names_size; ++iterator)
		{
			/* TODO: Remove this workaround when type map and future/function stringification is implemented */
			if (value_names[iterator] != NULL)
			{
				size_t size;

				char *buffer = serial_serialize(s, value_array[iterator], &size, allocator);

				log_write("metacall", LOG_LEVEL_DEBUG, "(%s == %s)", buffer, value_names[iterator]);

				EXPECT_GT((size_t)size, (size_t)0);

				EXPECT_EQ((int)0, (int)strncmp(buffer, value_names[iterator], size - 1));

				memory_allocator_deallocate(allocator, buffer);

				value_type_destroy(value_array[iterator]);
			}
		}
	}

	// Clear RapidJSON serial
	EXPECT_EQ((int)0, (int)serial_clear(serial_create(rapid_json_name())));

	// Clear MetaCall serial
	EXPECT_EQ((int)0, (int)serial_clear(serial_create(metacall_name())));

	// Destroy serial
	serial_destroy();

	// Destroy allocator
	memory_allocator_destroy(allocator);
}